

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall crnlib::dxt_hc::determine_alpha_endpoints(dxt_hc *this)

{
  _Iter_comp_val<std::less<Node>_> *p_Var1;
  float fVar2;
  float fVar3;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar4;
  ushort uVar5;
  uint uVar6;
  tile_details *ptVar7;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *__topIndex;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar8;
  task_pool *ptVar9;
  alpha_cluster *paVar10;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar11;
  dxt_hc *pdVar12;
  pointer pNVar13;
  uint uVar14;
  int iVar15;
  executable_task *peVar16;
  bool bVar17;
  int iVar18;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar19;
  uint uVar20;
  byte bVar21;
  byte bVar22;
  dxt_hc *pdVar23;
  ulong uVar24;
  void *pvVar25;
  uint uVar26;
  uint uVar27;
  _Iter_comp_val<std::less<Node>_> *__holeIndex;
  code *in_R8;
  _Iter_comp_val<std::less<Node>_> *in_R9;
  _Iter_comp_val<std::less<Node>_> *p_Var28;
  long lVar29;
  void *pvVar30;
  elemental_vector *peVar31;
  long lVar32;
  ulong uVar33;
  uint64 uVar34;
  ulong uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  Node __value;
  vector<Node>_conflict1 nodes;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> endpoints;
  vector<unsigned_int> weights;
  vector<crnlib::vec<2U,_float>_> vectors;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> queue;
  tree_clusterizer<crnlib::vec<2U,_float>_> vq;
  ulong local_178;
  elemental_vector local_168;
  elemental_vector local_158;
  vector<unsigned_int> local_148;
  vector<crnlib::vec<2U,_float>_> local_138;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_128;
  dxt_hc *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> local_108;
  pointer local_e8;
  ulong local_e0;
  tree_clusterizer<crnlib::vec<2U,_float>_> local_d8;
  
  uVar6 = this->m_pTask_pool->m_num_threads;
  local_158.m_p = (void *)0x0;
  local_158.m_size = 0;
  local_158.m_capacity = 0;
  uVar14 = this->m_num_alpha_blocks;
  if (uVar14 != 0) {
    uVar27 = (this->m_tiles).m_size;
    uVar26 = 0;
    lVar32 = 0x2c;
    uVar24 = 0;
    uVar20 = uVar27;
    do {
      if (uVar20 == 0) {
        uVar20 = 0;
      }
      else {
        lVar29 = 0;
        uVar33 = 0;
        do {
          ptVar7 = (this->m_tiles).m_p;
          iVar18 = *(int *)((long)(ptVar7->color_endpoint).m_s + lVar29 + -0xc);
          if (iVar18 != 0) {
            ppVar4 = *(pair<crnlib::vec<2U,_float>,_unsigned_int> **)
                      ((long)(ptVar7->color_endpoint).m_s + lVar29 + lVar32 + -0x14);
            uVar36 = (int)ppVar4;
            uVar37 = (int)((ulong)ppVar4 >> 0x20);
            if (local_158.m_capacity <= uVar26) {
              uStack_110 = 0;
              in_R8 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover;
              in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
              local_118 = ppVar4;
              elemental_vector::increase_capacity
                        (&local_158,uVar26 + 1,true,0xc,
                         vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover,
                         false);
              uVar36 = (undefined4)local_118;
              uVar37 = local_118._4_4_;
              uVar26 = local_158.m_size;
            }
            *(ulong *)((long)local_158.m_p + (ulong)uVar26 * 0xc) = CONCAT44(uVar37,uVar36);
            *(int *)((long)local_158.m_p + (ulong)uVar26 * 0xc + 8) = iVar18;
            uVar26 = local_158.m_size + 1;
            local_158.m_size = uVar26;
            uVar27 = (this->m_tiles).m_size;
          }
          uVar33 = uVar33 + 1;
          lVar29 = lVar29 + 0x48;
        } while (uVar33 < uVar27);
        uVar14 = this->m_num_alpha_blocks;
        uVar20 = uVar27;
      }
      uVar24 = uVar24 + 1;
      lVar32 = lVar32 + 8;
    } while (uVar24 < uVar14);
  }
  local_168.m_p = (void *)0x0;
  local_168.m_size = 0;
  local_168.m_capacity = 0;
  uVar14 = uVar6 + 1;
  if (uVar14 != 0) {
    uVar27 = 0;
    iVar18 = 1;
    pvVar30 = local_158.m_p;
    do {
      pvVar25 = (void *)(((ulong)(local_158.m_size * iVar18) / (ulong)uVar14) * 0xc +
                        (long)local_158.m_p);
      if (pvVar30 != pvVar25) {
        if (local_168.m_capacity <= uVar27) {
          in_R8 = vector<Node>::object_mover;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    (&local_168,uVar27 + 1,true,0x10,vector<Node>::object_mover,false);
          uVar27 = local_168.m_size;
        }
        *(void **)((long)local_168.m_p + (ulong)uVar27 * 0x10) = pvVar30;
        *(void **)((long)local_168.m_p + (ulong)uVar27 * 0x10 + 8) = pvVar25;
        uVar27 = local_168.m_size + 1;
        local_168.m_size = uVar27;
      }
      iVar15 = iVar18 - uVar6;
      iVar18 = iVar18 + 1;
      pvVar30 = pvVar25;
    } while (iVar15 != 1);
    if (uVar27 != 0) {
      lVar32 = 0;
      uVar34 = 0;
      do {
        task_pool::queue_task
                  (this->m_pTask_pool,determine_alpha_endpoints::Node::sort_task,uVar34,
                   (void *)((long)local_168.m_p + lVar32));
        uVar34 = uVar34 + 1;
        lVar32 = lVar32 + 0x10;
      } while (uVar34 < (local_168._8_8_ & 0xffffffff));
    }
  }
  local_120 = this;
  task_pool::join(this->m_pTask_pool);
  local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_168.m_size != 0) {
    lVar32 = 0;
    uVar24 = 0;
    do {
      std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                (&local_108,(value_type_conflict *)((long)local_168.m_p + lVar32));
      uVar24 = uVar24 + 1;
      lVar32 = lVar32 + 0x10;
    } while (uVar24 < (local_168._8_8_ & 0xffffffff));
  }
  local_138.m_p = (vec<2U,_float> *)0x0;
  local_138.m_size = 0;
  local_138.m_capacity = 0;
  local_148.m_p = (uint *)0x0;
  local_148.m_size = 0;
  local_148.m_capacity = 0;
  vector<crnlib::vec<2U,_float>_>::reserve(&local_138,local_158.m_size);
  vector<unsigned_int>::reserve(&local_148,local_158.m_size);
  pdVar23 = local_120;
  if (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    do {
      pNVar13 = local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pdVar12 = local_120;
      ppVar4 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)
               (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start)->p;
      local_d8.m_weightedVectors.m_p =
           (vec<2U,_float> *)
           (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start)->pEnd;
      local_d8.m_vectors = &ppVar4[1].first;
      ppVar19 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_d8.m_vectors;
      if (0x10 < (long)local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_start) {
        __topIndex = local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].p;
        local_128 = local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].pEnd;
        ppVar11 = (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start)->pEnd;
        local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].p =
             (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start)->p;
        local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].pEnd = ppVar11;
        uVar24 = (long)local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                 (-0x10 - (long)local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                super__Vector_impl_data._M_start);
        lVar32 = (long)uVar24 >> 4;
        if (lVar32 < 3) {
          __holeIndex = (_Iter_comp_val<std::less<Node>_> *)0x0;
        }
        else {
          in_R8 = (code *)((lVar32 - (lVar32 + -1 >> 0x3f)) + -1 >> 1);
          p_Var28 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          do {
            __holeIndex = (_Iter_comp_val<std::less<Node>_> *)((long)p_Var28 * 2 + 2);
            p_Var1 = (_Iter_comp_val<std::less<Node>_> *)((long)p_Var28 * 2 + 1);
            ppVar19 = ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)__holeIndex))->p;
            ppVar8 = ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                               super__Vector_impl_data._M_start + (long)p_Var1))->p;
            bVar21 = 0;
            lVar29 = 0;
            do {
              fVar2 = (ppVar8->first).m_s[lVar29];
              fVar3 = (ppVar19->first).m_s[lVar29];
              if (fVar2 < fVar3) goto LAB_00181f51;
              bVar22 = ~bVar21;
              lVar29 = 1;
              bVar21 = 1;
            } while ((bool)(bVar22 & fVar2 == fVar3));
            bVar21 = 0;
            lVar29 = 0;
            do {
              fVar2 = (ppVar19->first).m_s[lVar29];
              fVar3 = (ppVar8->first).m_s[lVar29];
              if (fVar2 < fVar3) goto LAB_00181f54;
              bVar22 = ~bVar21;
              lVar29 = 1;
              bVar21 = 1;
            } while ((bool)(bVar22 & fVar2 == fVar3));
            if (ppVar8->second < ppVar19->second) {
LAB_00181f51:
              __holeIndex = p_Var1;
            }
LAB_00181f54:
            ppVar19 = ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                super__Vector_impl_data._M_start + (long)__holeIndex))->pEnd;
            ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)p_Var28))->p =
                 ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                           super__Vector_impl_data._M_start + (long)__holeIndex))->p;
            ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_start + (long)p_Var28))->pEnd = ppVar19;
            p_Var28 = __holeIndex;
            in_R9 = __holeIndex;
          } while ((long)__holeIndex < (long)in_R8);
        }
        if (((uVar24 & 0x10) == 0) &&
           (__holeIndex == (_Iter_comp_val<std::less<Node>_> *)(lVar32 + -2 >> 1))) {
          p_Var28 = (_Iter_comp_val<std::less<Node>_> *)((long)__holeIndex * 2 + 1);
          ppVar19 = ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                              super__Vector_impl_data._M_start + (long)p_Var28))->pEnd;
          ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)__holeIndex))->p =
               ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_start + (long)p_Var28))->p;
          ((Node *)(local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start + (long)__holeIndex))->pEnd = ppVar19;
          __holeIndex = p_Var28;
        }
        __value.pEnd = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)in_R8;
        __value.p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_128;
        local_118 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_d8.m_vectors;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<crnlib::dxt_hc::determine_alpha_endpoints()::Node*,std::vector<crnlib::dxt_hc::determine_alpha_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>>,long,crnlib::dxt_hc::determine_alpha_endpoints()::Node,__gnu_cxx::__ops::_Iter_comp_val<std::less<crnlib::dxt_hc::determine_alpha_endpoints()::Node>>>
                  ((__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>)
                   local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)__holeIndex,(long)__topIndex,__value,in_R9
                  );
        ppVar19 = local_118;
        pdVar23 = pdVar12;
      }
      local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish = pNVar13 + -1;
      if (ppVar19 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_d8.m_weightedVectors.m_p) {
        std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                  (&local_108,(value_type_conflict *)&local_d8);
      }
      if (local_138.m_size == 0) {
LAB_00182050:
        if (local_138.m_capacity <= local_138.m_size) {
          in_R8 = (code *)0x0;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_138,local_138.m_size + 1,true,8,(object_mover)0x0,
                     false);
        }
        *(undefined8 *)local_138.m_p[local_138.m_size].m_s = *(undefined8 *)(ppVar4->first).m_s;
        local_138.m_size = local_138.m_size + 1;
        if (local_148.m_capacity <= local_148.m_size) {
          in_R8 = (code *)0x0;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_148,local_148.m_size + 1,true,4,(object_mover)0x0,
                     false);
        }
        local_148.m_p[local_148.m_size] = ppVar4->second;
        local_148.m_size = local_148.m_size + 1;
      }
      else {
        bVar17 = true;
        lVar32 = 0;
        while( true ) {
          fVar2 = (ppVar4->first).m_s[lVar32];
          fVar3 = local_138.m_p[local_138.m_size - 1].m_s[lVar32];
          if (!bVar17) break;
          lVar32 = 1;
          bVar17 = false;
          if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) break;
        }
        if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) goto LAB_00182050;
        uVar27 = local_148.m_size - 1;
        if (CARRY4(local_148.m_p[uVar27],ppVar4->second)) {
          local_148.m_p[uVar27] = 0xffffffff;
        }
        else {
          local_148.m_p[uVar27] = local_148.m_p[uVar27] + ppVar4->second;
        }
      }
    } while (local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  local_e8 = local_108.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_d8.m_node_index_map.m_values.m_p = (raw_node *)0x0;
  local_d8.m_node_index_map.m_values.m_size = 0;
  local_d8.m_node_index_map.m_values.m_capacity = 0;
  local_d8.m_vectorComparison.m_p = (bool *)0x0;
  local_d8.m_vectorComparison.m_size = 0;
  local_d8.m_vectorComparison.m_capacity = 0;
  local_d8.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfoRight.m_size = 0;
  local_d8.m_vectorsInfoRight.m_capacity = 0;
  local_d8.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfoLeft.m_size = 0;
  local_d8.m_vectorsInfoLeft.m_capacity = 0;
  local_d8.m_vectorsInfo.m_p = (VectorInfo *)0x0;
  local_d8.m_vectorsInfo.m_size = 0;
  local_d8.m_vectorsInfo.m_capacity = 0;
  local_d8.m_weightedDotProducts.m_p = (double *)0x0;
  local_d8.m_weightedDotProducts.m_size = 0;
  local_d8.m_weightedDotProducts.m_capacity = 0;
  local_d8.m_weightedVectors.m_p = (vec<2U,_float> *)0x0;
  local_d8.m_weightedVectors.m_size = 0;
  local_d8.m_weightedVectors.m_capacity = 0;
  local_d8.m_node_index_map.m_hash_shift = 0x20;
  local_d8.m_node_index_map.m_num_valid = 0;
  local_d8.m_node_index_map.m_grow_threshold = 0;
  local_d8.m_nodes.m_p = (vq_node *)0x0;
  local_d8.m_nodes.m_size = 0;
  local_d8.m_nodes.m_capacity = 0;
  local_d8.m_codebook.m_p = (vec<2U,_float> *)0x0;
  local_d8.m_codebook.m_size = 0;
  local_d8.m_codebook.m_capacity = 0;
  uVar27 = (pdVar23->m_params).m_alpha_endpoint_codebook_size;
  if (pdVar23->m_num_tiles < uVar27) {
    uVar27 = pdVar23->m_num_tiles;
  }
  tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
            (&local_d8,local_138.m_p,local_148.m_p,local_138.m_size,uVar27,false,
             pdVar23->m_pTask_pool);
  local_118 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)&pdVar23->m_alpha_clusters;
  vector<crnlib::dxt_hc::alpha_cluster>::resize
            ((vector<crnlib::dxt_hc::alpha_cluster> *)local_118,local_d8.m_codebook.m_size,false);
  local_128 = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)(ulong)uVar14;
  if (uVar14 != 0) {
    uVar34 = 0;
    do {
      ptVar9 = pdVar23->m_pTask_pool;
      peVar16 = (executable_task *)crnlib_malloc(0x28);
      peVar16->_vptr_executable_task = (_func_int **)&PTR_execute_task_001db950;
      peVar16[1]._vptr_executable_task = (_func_int **)pdVar23;
      peVar16[2]._vptr_executable_task = (_func_int **)determine_alpha_endpoint_clusters_task;
      peVar16[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&peVar16[4]._vptr_executable_task = 1;
      task_pool::queue_task(ptVar9,peVar16,uVar34,&local_d8);
      uVar34 = uVar34 + 1;
    } while (local_128 != (pair<crnlib::vec<6U,_float>,_unsigned_int> *)uVar34);
  }
  task_pool::join(pdVar23->m_pTask_pool);
  uVar24 = (ulong)pdVar23->m_num_alpha_blocks;
  if (pdVar23->m_num_alpha_blocks == 0) {
    uVar27 = pdVar23->m_num_blocks;
    uVar24 = 0;
  }
  else {
    uVar27 = pdVar23->m_num_blocks;
    local_178 = 0;
    uVar26 = uVar27;
    do {
      if (uVar26 == 0) {
        local_178 = local_178 + 1;
        uVar26 = 0;
      }
      else {
        uVar26 = (pdVar23->m_params).m_alpha_component_indices[local_178];
        local_e0 = local_178 + 1;
        uVar24 = 0;
        do {
          ptVar7 = (pdVar23->m_tiles).m_p;
          if (ptVar7[uVar24].pixels.m_size != 0) {
            ptVar7 = ptVar7 + uVar24;
            uVar5 = ptVar7->cluster_indices[local_178 + 1];
            paVar10 = ((vector<crnlib::dxt_hc::alpha_cluster> *)local_118)->m_p;
            peVar31 = (elemental_vector *)
                      ((long)paVar10->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0x18));
            uVar27 = *(uint *)((long)paVar10->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0x10));
            uVar33 = 0;
            do {
              bVar21 = (ptVar7->pixels).m_p[uVar33].field_0.c[uVar26];
              if (*(uint *)((long)paVar10->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0xc)) <=
                  uVar27) {
                elemental_vector::increase_capacity
                          (peVar31,uVar27 + 1,true,4,(object_mover)0x0,false);
                uVar27 = *(uint *)((long)paVar10->alpha_values +
                                  ((ulong)((uint)uVar5 * 0x90) - 0x10));
              }
              *(uint *)((long)peVar31->m_p + (ulong)uVar27 * 4) =
                   (uint)bVar21 * 0x10101 | 0xff000000;
              uVar27 = *(int *)((long)paVar10->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0x10))
                       + 1;
              *(uint *)((long)paVar10->alpha_values + ((ulong)((uint)uVar5 * 0x90) - 0x10)) = uVar27
              ;
              uVar33 = uVar33 + 1;
            } while (uVar33 < (ptVar7->pixels).m_size);
            uVar27 = local_120->m_num_blocks;
            pdVar23 = local_120;
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar27);
        uVar24 = (ulong)pdVar23->m_num_alpha_blocks;
        local_178 = local_e0;
        uVar26 = uVar27;
      }
    } while (local_178 < uVar24);
  }
  if (uVar27 != 0) {
    lVar32 = 2;
    uVar33 = 0;
    do {
      iVar18 = (int)uVar24;
      uVar24 = 0;
      if (iVar18 != 0) {
        lVar29 = 0x10;
        uVar35 = 0;
        do {
          uVar5 = (pdVar23->m_tiles).m_p[(pdVar23->m_tile_indices).m_p[uVar33]].cluster_indices
                  [uVar35 + 1];
          *(ushort *)((long)&((pdVar23->m_endpoint_indices).m_p)->field_0 + uVar35 * 2 + lVar32) =
               uVar5;
          if (((uVar33 & 1) == 0) || (pdVar23->m_has_subblocks == false)) {
            paVar10 = ((vector<crnlib::dxt_hc::alpha_cluster> *)local_118)->m_p;
            peVar31 = (elemental_vector *)
                      ((long)&paVar10->blocks[0].m_p + lVar29 + (ulong)((uint)uVar5 * 0x90));
            uVar27 = *(uint *)((long)&paVar10->blocks[0].m_size +
                              lVar29 + (ulong)((uint)uVar5 * 0x90));
            if (*(uint *)((long)&paVar10->blocks[0].m_capacity +
                         lVar29 + (ulong)((uint)uVar5 * 0x90)) <= uVar27) {
              elemental_vector::increase_capacity(peVar31,uVar27 + 1,true,4,(object_mover)0x0,false)
              ;
              uVar27 = peVar31->m_size;
            }
            *(int *)((long)peVar31->m_p + (ulong)uVar27 * 4) = (int)uVar33;
            peVar31->m_size = peVar31->m_size + 1;
          }
          uVar35 = uVar35 + 1;
          uVar24 = (ulong)pdVar23->m_num_alpha_blocks;
          lVar29 = lVar29 + 0x10;
        } while (uVar35 < uVar24);
        uVar27 = pdVar23->m_num_blocks;
      }
      uVar33 = uVar33 + 1;
      lVar32 = lVar32 + 8;
    } while (uVar33 < uVar27);
  }
  if (uVar14 != 0) {
    uVar34 = 0;
    do {
      ptVar9 = pdVar23->m_pTask_pool;
      peVar16 = (executable_task *)crnlib_malloc(0x28);
      peVar16->_vptr_executable_task = (_func_int **)&PTR_execute_task_001db950;
      peVar16[1]._vptr_executable_task = (_func_int **)pdVar23;
      peVar16[2]._vptr_executable_task = (_func_int **)determine_alpha_endpoint_codebook_task;
      peVar16[3]._vptr_executable_task = (_func_int **)0x0;
      *(undefined4 *)&peVar16[4]._vptr_executable_task = 1;
      task_pool::queue_task(ptVar9,peVar16,uVar34,(void *)0x0);
      uVar34 = uVar34 + 1;
    } while (local_128 != (pair<crnlib::vec<6U,_float>,_unsigned_int> *)uVar34);
  }
  task_pool::join(pdVar23->m_pTask_pool);
  tree_clusterizer<crnlib::vec<2U,_float>_>::~tree_clusterizer(&local_d8);
  pNVar13 = local_e8;
  if (local_148.m_p != (uint *)0x0) {
    crnlib_free(local_148.m_p);
  }
  if (local_138.m_p != (vec<2U,_float> *)0x0) {
    crnlib_free(local_138.m_p);
  }
  if (pNVar13 != (pointer)0x0) {
    operator_delete(pNVar13);
  }
  if (local_168.m_p != (void *)0x0) {
    crnlib_free(local_168.m_p);
  }
  if (local_158.m_p != (void *)0x0) {
    crnlib_free(local_158.m_p);
  }
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoints() {
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  crnlib::vector<std::pair<vec2F, uint> > endpoints;
  for (uint a = 0; a < m_num_alpha_blocks; a++) {
    for (uint t = 0; t < m_tiles.size(); t++) {
      if (m_tiles[t].pixels.size())
        endpoints.push_back(std::make_pair(m_tiles[t].alpha_endpoints[a], m_tiles[t].pixels.size()));
    }
  }

  struct Node {
    std::pair<vec2F, uint> *p, *pEnd;
    Node (std::pair<vec2F, uint>* begin, std::pair<vec2F, uint>* end) : p(begin), pEnd(end) {}
    bool operator<(const Node& other) const { return *p > *other.p; }
    static void sort_task(uint64 data, void* ptr) { std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd); }
  };

  crnlib::vector<Node> nodes;
  Node node(0, endpoints.get_ptr());
  for (uint i = 0; i < num_tasks; i++) {
    node.p = node.pEnd;
    node.pEnd = endpoints.get_ptr() + endpoints.size() * (i + 1) / num_tasks;
    if (node.p != node.pEnd)
      nodes.push_back(node);
  }

  for (uint i = 0; i < nodes.size(); i++)
    m_pTask_pool->queue_task(&Node::sort_task, i, &nodes[i]);
  m_pTask_pool->join();

  std::priority_queue<Node> queue;
  for (uint i = 0; i < nodes.size(); i++)
    queue.push(nodes[i]);

  crnlib::vector<vec2F> vectors;
  crnlib::vector<uint> weights;
  vectors.reserve(endpoints.size());
  weights.reserve(endpoints.size());
  while (queue.size()) {
    Node node = queue.top();
    std::pair<vec2F, uint>* endpoint = node.p++;
    queue.pop();
    if (node.p != node.pEnd)
      queue.push(node);
    if (!vectors.size() || endpoint->first != vectors.back()) {
      vectors.push_back(endpoint->first);
      weights.push_back(endpoint->second);
    } else if (weights.back() > UINT_MAX - endpoint->second) {
      weights.back() = UINT_MAX;
    } else {
      weights.back() += endpoint->second;
    }
  }

  tree_clusterizer<vec2F> vq;
  vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), math::minimum<uint>(m_num_tiles, m_params.m_alpha_endpoint_codebook_size), false, m_pTask_pool);
  m_alpha_clusters.resize(vq.get_codebook_size());

  for (uint i = 0; i < num_tasks; i++)
    m_pTask_pool->queue_object_task(this, &dxt_hc::determine_alpha_endpoint_clusters_task, i, &vq);
  m_pTask_pool->join();

  for (uint a = 0; a < m_num_alpha_blocks; a++) {
    uint component_index = m_params.m_alpha_component_indices[a];
    for (uint t = 0; t < m_num_blocks; t++) {
      crnlib::vector<color_quad_u8>& source = m_tiles[t].pixels;
      if (source.size()) {
        crnlib::vector<color_quad_u8>& destination = m_alpha_clusters[m_tiles[t].cluster_indices[cAlpha0 + a]].pixels;
        for (uint p = 0; p < source.size(); p++)
          destination.push_back(color_quad_u8(source[p][component_index]));
      }
    }
  }

  for (uint b = 0; b < m_num_blocks; b++) {
    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint cluster_index = m_tiles[m_tile_indices[b]].cluster_indices[cAlpha0 + a];
      m_endpoint_indices[b].component[cAlpha0 + a] = cluster_index;
      if (!(m_has_subblocks && b & 1))
        m_alpha_clusters[cluster_index].blocks[cAlpha0 + a].push_back(b);
    }
  }

  for (uint i = 0; i < num_tasks; i++)
    m_pTask_pool->queue_object_task(this, &dxt_hc::determine_alpha_endpoint_codebook_task, i, NULL);
  m_pTask_pool->join();
}